

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

CAmount wallet::coinselector_tests::make_hard_case
                  (int utxos,vector<wallet::COutput,_std::allocator<wallet::COutput>_> *utxo_pool)

{
  long lVar1;
  int in_EDI;
  long in_FS_OFFSET;
  vector<wallet::COutput,_std::allocator<wallet::COutput>_> *in_stack_00000010;
  int i;
  CAmount target;
  vector<wallet::COutput,_std::allocator<wallet::COutput>_> *in_stack_ffffffffffffffb8;
  undefined4 local_34;
  undefined8 local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::clear(in_stack_ffffffffffffffb8);
  local_30 = 0;
  for (local_34 = 0; local_34 < in_EDI; local_34 = local_34 + 1) {
    local_30 = (1L << ((char)in_EDI + (char)local_34 & 0x3fU)) + local_30;
    add_coin((CAmount *)utxo_pool,target._4_4_,in_stack_00000010);
    add_coin((CAmount *)utxo_pool,target._4_4_,in_stack_00000010);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

static CAmount make_hard_case(int utxos, std::vector<COutput>& utxo_pool)
{
    utxo_pool.clear();
    CAmount target = 0;
    for (int i = 0; i < utxos; ++i) {
        target += CAmount{1} << (utxos+i);
        add_coin(CAmount{1} << (utxos+i), 2*i, utxo_pool);
        add_coin((CAmount{1} << (utxos+i)) + (CAmount{1} << (utxos-1-i)), 2*i + 1, utxo_pool);
    }
    return target;
}